

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadString
          (EpsCopyInputStream *this,char *ptr,int size,string *s)

{
  char *pcVar1;
  size_t __n;
  
  __n = (size_t)size;
  if ((long)(this->buffer_end_ + (0x10 - (long)ptr)) < (long)__n) {
    pcVar1 = ReadStringFallback(this,ptr,size,s);
    return pcVar1;
  }
  std::__cxx11::string::resize((ulong)s);
  memcpy((s->_M_dataplus)._M_p,ptr,__n);
  return ptr + __n;
}

Assistant:

PROTOBUF_NODISCARD const char* ReadString(const char* ptr, int size,
                                            std::string* s) {
    if (size <= buffer_end_ + kSlopBytes - ptr) {
      // Fundamentally we just want to do assign to the string.
      // However micro-benchmarks regress on string reading cases. So we copy
      // the same logic from the old CodedInputStream ReadString. Note: as of
      // Apr 2021, this is still a significant win over `assign()`.
      absl::strings_internal::STLStringResizeUninitialized(s, size);
      char* z = &(*s)[0];
      memcpy(z, ptr, size);
      return ptr + size;
    }
    return ReadStringFallback(ptr, size, s);
  }